

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteCord
          (EpsCopyOutputStream *this,Cord *cord,uint8_t *ptr)

{
  uint uVar1;
  ptrdiff_t pVar2;
  size_t sVar3;
  int s;
  uint8_t *ptr_local;
  Cord *cord_local;
  EpsCopyOutputStream *this_local;
  
  pVar2 = GetSize(this,ptr);
  if (this->stream_ == (ZeroCopyOutputStream *)0x0) {
    sVar3 = absl::lts_20240722::Cord::size(cord);
    if ((long)(int)pVar2 < (long)sVar3) {
      this_local = (EpsCopyOutputStream *)Error(this);
    }
    else {
      this_local = (EpsCopyOutputStream *)anon_unknown_1::CopyCordToArray(cord,ptr);
    }
  }
  else {
    sVar3 = absl::lts_20240722::Cord::size(cord);
    if (((long)(int)pVar2 < (long)sVar3) ||
       (sVar3 = absl::lts_20240722::Cord::size(cord), 0x1ff < (long)sVar3)) {
      this_local = (EpsCopyOutputStream *)Trim(this,ptr);
      uVar1 = (*this->stream_->_vptr_ZeroCopyOutputStream[7])(this->stream_,cord);
      if ((uVar1 & 1) == 0) {
        this_local = (EpsCopyOutputStream *)Error(this);
      }
    }
    else {
      this_local = (EpsCopyOutputStream *)anon_unknown_1::CopyCordToArray(cord,ptr);
    }
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteCord(const absl::Cord& cord, uint8_t* ptr) {
  int s = GetSize(ptr);
  if (stream_ == nullptr) {
    if (static_cast<int64_t>(cord.size()) <= s) {
      // Just copy it to the current buffer.
      return CopyCordToArray(cord, ptr);
    } else {
      return Error();
    }
  } else if (static_cast<int64_t>(cord.size()) <= s &&
             static_cast<int64_t>(cord.size()) < kMaxCordBytesToCopy) {
    // Just copy it to the current buffer.
    return CopyCordToArray(cord, ptr);
  } else {
    // Back up to the position where the Cord should start.
    ptr = Trim(ptr);
    if (!stream_->WriteCord(cord)) return Error();
    return ptr;
  }
}